

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notification.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::Notification::WaitForNotificationWithDeadline(Notification *this,Time deadline)

{
  byte bVar1;
  Notification *pNVar2;
  KernelTimeout local_50;
  code *local_48;
  char acStack_40 [8];
  code *local_38;
  atomic<bool> *local_30;
  
  AbslInternalTraceWait_lts_20250127(this,kNotification);
  bVar1 = (this->notified_yet_)._M_base._M_i;
  if ((bVar1 & 1) == 0) {
    local_30 = &this->notified_yet_;
    acStack_40[0] = '\0';
    acStack_40[1] = '\0';
    acStack_40[2] = '\0';
    acStack_40[3] = '\0';
    acStack_40[4] = '\0';
    acStack_40[5] = '\0';
    acStack_40[6] = '\0';
    acStack_40[7] = '\0';
    local_38 = Condition::CastAndCallFunction<std::atomic<bool>const>;
    local_48 = HasBeenNotifiedInternal;
    synchronization_internal::KernelTimeout::KernelTimeout(&local_50,deadline);
    bVar1 = Mutex::LockWhenCommon(&this->mutex_,(Condition *)&local_48,local_50,true);
    Mutex::Unlock(&this->mutex_);
  }
  pNVar2 = (Notification *)0x0;
  if ((bool)(bVar1 & 1) != false) {
    pNVar2 = this;
  }
  AbslInternalTraceContinue_lts_20250127(pNVar2,kNotification);
  return (bool)(bVar1 & 1);
}

Assistant:

bool Notification::WaitForNotificationWithDeadline(absl::Time deadline) const {
  base_internal::TraceWait(this, TraceObjectKind());
  bool notified = HasBeenNotifiedInternal(&this->notified_yet_);
  if (!notified) {
    notified = this->mutex_.LockWhenWithDeadline(
        Condition(&HasBeenNotifiedInternal, &this->notified_yet_), deadline);
    this->mutex_.Unlock();
  }
  base_internal::TraceContinue(notified ? this : nullptr, TraceObjectKind());
  return notified;
}